

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O0

Status __thiscall leveldb::Env::NewAppendableFile(Env *this,string *fname,WritableFile **result)

{
  Slice local_48;
  Slice local_38;
  WritableFile **result_local;
  string *fname_local;
  Env *this_local;
  
  result_local = result;
  fname_local = fname;
  this_local = this;
  Slice::Slice(&local_38,"NewAppendableFile");
  Slice::Slice(&local_48,(string *)result_local);
  Status::NotSupported((Status *)this,&local_38,&local_48);
  return (Status)(char *)this;
}

Assistant:

Status Env::NewAppendableFile(const std::string& fname, WritableFile** result) {
  return Status::NotSupported("NewAppendableFile", fname);
}